

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_one_ech_config
              (ptls_hpke_kem_t **kems,ptls_hpke_cipher_suite_t **ciphers,
              st_decoded_ech_config_t *decoded,uint8_t **src,uint8_t *end)

{
  byte *pbVar1;
  long lVar2;
  uint8_t **ppuVar3;
  int iVar4;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *puStack_170;
  uint16_t type;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *local_140;
  long local_138;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  size_t i_1;
  uint16_t aead_id;
  uint8_t *puStack_100;
  uint16_t kdf_id;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *local_d0;
  long local_c8;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  size_t i;
  undefined1 local_90 [6];
  uint16_t kem_id;
  int local_3c;
  char *pcStack_38;
  int ret;
  char *public_name_buf;
  uint8_t *end_local;
  uint8_t **src_local;
  st_decoded_ech_config_t *decoded_local;
  ptls_hpke_cipher_suite_t **ciphers_local;
  ptls_hpke_kem_t **kems_local;
  
  pcStack_38 = (char *)0x0;
  public_name_buf = (char *)end;
  end_local = (uint8_t *)src;
  src_local = (uint8_t **)decoded;
  decoded_local = (st_decoded_ech_config_t *)ciphers;
  ciphers_local = (ptls_hpke_cipher_suite_t **)kems;
  memset(local_90,0,0x50);
  memcpy(decoded,local_90,0x50);
  local_3c = ptls_decode8((uint8_t *)src_local,(uint8_t **)end_local,(uint8_t *)public_name_buf);
  if ((local_3c == 0) &&
     (local_3c = ptls_decode16((uint16_t *)((long)&i + 6),(uint8_t **)end_local,
                               (uint8_t *)public_name_buf), ppuVar3 = src_local, local_3c == 0)) {
    for (_capacity = 0; ciphers_local[_capacity] != (ptls_hpke_cipher_suite_t *)0x0;
        _capacity = _capacity + 1) {
      if ((ciphers_local[_capacity]->id).kdf == i._6_2_) {
        src_local[1] = (uint8_t *)ciphers_local[_capacity];
        break;
      }
    }
    _block_size = 2;
    if ((ulong)((long)public_name_buf - *(long *)end_local) < 2) {
      local_3c = 0x32;
    }
    else {
      _block_size64 = 0;
      do {
        pbVar1 = *(byte **)end_local;
        *(byte **)end_local = pbVar1 + 1;
        _block_size64 = _block_size64 << 8 | (ulong)*pbVar1;
        _block_size = _block_size - 1;
      } while (_block_size != 0);
      if ((ulong)((long)public_name_buf - *(long *)end_local) < _block_size64) {
        local_3c = 0x32;
      }
      else {
        local_c8 = *(long *)end_local + _block_size64;
        if (*(long *)end_local == local_c8) {
          local_3c = 0x32;
        }
        else {
          __capacity_1 = ptls_iovec_init(*(void **)end_local,local_c8 - *(long *)end_local);
          ppuVar3[2] = (uint8_t *)_capacity_1;
          ppuVar3[3] = local_d0;
          *(long *)end_local = local_c8;
          if (*(long *)end_local == local_c8) {
            _block_size_1 = 2;
            if ((ulong)((long)public_name_buf - *(long *)end_local) < 2) {
              local_3c = 0x32;
            }
            else {
              _block_size64_1 = 0;
              do {
                pbVar1 = *(byte **)end_local;
                *(byte **)end_local = pbVar1 + 1;
                _block_size64_1 = _block_size64_1 << 8 | (ulong)*pbVar1;
                _block_size_1 = _block_size_1 - 1;
              } while (_block_size_1 != 0);
              _block_size_1 = 0;
              if ((ulong)((long)public_name_buf - *(long *)end_local) < _block_size64_1) {
                local_3c = 0x32;
              }
              else {
                puStack_100 = (uint8_t *)(*(long *)end_local + _block_size64_1);
                iVar4 = local_3c;
                do {
                  local_3c = iVar4;
                  local_3c = ptls_decode16((uint16_t *)((long)&i_1 + 6),(uint8_t **)end_local,
                                           puStack_100);
                  if ((local_3c != 0) ||
                     (local_3c = ptls_decode16((uint16_t *)((long)&i_1 + 4),(uint8_t **)end_local,
                                               puStack_100), local_3c != 0)) goto LAB_00117dde;
                  if (src_local[4] == (uint8_t *)0x0) {
                    for (_capacity_2 = 0; *(long *)(&decoded_local->id + _capacity_2 * 8) != 0;
                        _capacity_2 = _capacity_2 + 1) {
                      if ((**(short **)(&decoded_local->id + _capacity_2 * 8) == i_1._6_2_) &&
                         (*(short *)(*(long *)(&decoded_local->id + _capacity_2 * 8) + 2) ==
                          i_1._4_2_)) {
                        src_local[4] = *(uint8_t **)(&decoded_local->id + _capacity_2 * 8);
                        break;
                      }
                    }
                  }
                  iVar4 = 0;
                } while (*(uint8_t **)end_local != puStack_100);
                if (*(uint8_t **)end_local == puStack_100) {
                  local_3c = ptls_decode8((uint8_t *)(src_local + 5),(uint8_t **)end_local,
                                          (uint8_t *)public_name_buf);
                  if (local_3c == 0) {
                    _block_size_2 = 1;
                    if (public_name_buf == *(char **)end_local) {
                      local_3c = 0x32;
                    }
                    else {
                      _block_size64_2 = 0;
                      do {
                        pbVar1 = *(byte **)end_local;
                        *(byte **)end_local = pbVar1 + 1;
                        _block_size64_2 = _block_size64_2 << 8 | (ulong)*pbVar1;
                        _block_size_2 = _block_size_2 - 1;
                      } while (_block_size_2 != 0);
                      if ((ulong)((long)public_name_buf - *(long *)end_local) < _block_size64_2) {
                        local_3c = 0x32;
                      }
                      else {
                        local_138 = *(long *)end_local + _block_size64_2;
                        if (*(long *)end_local == local_138) {
                          local_3c = 0x32;
                        }
                        else {
                          pcStack_38 = duplicate_as_str(*(void **)end_local,
                                                        local_138 - *(long *)end_local);
                          if (pcStack_38 == (char *)0x0) {
                            local_3c = 0x201;
                          }
                          else {
                            iVar4 = ptls_server_name_is_ipaddr(pcStack_38);
                            ppuVar3 = src_local;
                            if (iVar4 == 0) {
                              __capacity_3 = ptls_iovec_init(*(void **)end_local,
                                                             local_138 - *(long *)end_local);
                              ppuVar3[6] = (uint8_t *)_capacity_3;
                              ppuVar3[7] = local_140;
                            }
                            else {
                              src_local[1] = (uint8_t *)0x0;
                              src_local[4] = (uint8_t *)0x0;
                            }
                            *(long *)end_local = local_138;
                            if (*(long *)end_local == local_138) {
                              _block_size_3 = 2;
                              if ((ulong)((long)public_name_buf - *(long *)end_local) < 2) {
                                local_3c = 0x32;
                              }
                              else {
                                _block_size64_3 = 0;
                                do {
                                  pbVar1 = *(byte **)end_local;
                                  *(byte **)end_local = pbVar1 + 1;
                                  _block_size64_3 = _block_size64_3 << 8 | (ulong)*pbVar1;
                                  _block_size_3 = _block_size_3 - 1;
                                } while (_block_size_3 != 0);
                                _block_size_3 = 0;
                                if ((ulong)((long)public_name_buf - *(long *)end_local) <
                                    _block_size64_3) {
                                  local_3c = 0x32;
                                }
                                else {
                                  puStack_170 = (uint8_t *)(*(long *)end_local + _block_size64_3);
                                  while (*(uint8_t **)end_local < puStack_170) {
                                    local_3c = ptls_decode16((uint16_t *)((long)&_capacity_4 + 6),
                                                             (uint8_t **)end_local,puStack_170);
                                    if (local_3c != 0) goto LAB_00117dde;
                                    _block_size_4 = 2;
                                    if ((ulong)((long)puStack_170 - *(long *)end_local) < 2) {
                                      local_3c = 0x32;
                                      goto LAB_00117dde;
                                    }
                                    _block_size64_4 = 0;
                                    do {
                                      pbVar1 = *(byte **)end_local;
                                      *(byte **)end_local = pbVar1 + 1;
                                      _block_size64_4 = _block_size64_4 << 8 | (ulong)*pbVar1;
                                      _block_size_4 = _block_size_4 - 1;
                                    } while (_block_size_4 != 0);
                                    if ((ulong)((long)puStack_170 - *(long *)end_local) <
                                        _block_size64_4) {
                                      local_3c = 0x32;
                                      goto LAB_00117dde;
                                    }
                                    lVar2 = *(long *)end_local;
                                    *(uint64_t *)end_local = lVar2 + _block_size64_4;
                                    if (*(long *)end_local != lVar2 + _block_size64_4) {
                                      local_3c = 0x32;
                                      goto LAB_00117dde;
                                    }
                                    if ((_capacity_4._6_2_ & 0x8000) != 0) {
                                      src_local[1] = (uint8_t *)0x0;
                                      src_local[4] = (uint8_t *)0x0;
                                    }
                                  }
                                  if (*(uint8_t **)end_local == puStack_170) {
                                    if (*(char **)end_local != public_name_buf) {
                                      local_3c = 0x32;
                                    }
                                  }
                                  else {
                                    local_3c = 0x32;
                                  }
                                }
                              }
                            }
                            else {
                              local_3c = 0x32;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  local_3c = 0x32;
                }
              }
            }
          }
          else {
            local_3c = 0x32;
          }
        }
      }
    }
  }
LAB_00117dde:
  free(pcStack_38);
  return local_3c;
}

Assistant:

static int decode_one_ech_config(ptls_hpke_kem_t **kems, ptls_hpke_cipher_suite_t **ciphers,
                                 struct st_decoded_ech_config_t *decoded, const uint8_t **src, const uint8_t *const end)
{
    char *public_name_buf = NULL;
    int ret;

    *decoded = (struct st_decoded_ech_config_t){0};

    if ((ret = ptls_decode8(&decoded->id, src, end)) != 0)
        goto Exit;
    uint16_t kem_id;
    if ((ret = ptls_decode16(&kem_id, src, end)) != 0)
        goto Exit;
    for (size_t i = 0; kems[i] != NULL; ++i) {
        if (kems[i]->id == kem_id) {
            decoded->kem = kems[i];
            break;
        }
    }
    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        decoded->public_key = ptls_iovec_init(*src, end - *src);
        *src = end;
    });
    ptls_decode_open_block(*src, end, 2, {
        do {
            uint16_t kdf_id;
            uint16_t aead_id;
            if ((ret = ptls_decode16(&kdf_id, src, end)) != 0)
                goto Exit;
            if ((ret = ptls_decode16(&aead_id, src, end)) != 0)
                goto Exit;
            if (decoded->cipher == NULL) {
                for (size_t i = 0; ciphers[i] != NULL; ++i) {
                    if (ciphers[i]->id.kdf == kdf_id && ciphers[i]->id.aead == aead_id) {
                        decoded->cipher = ciphers[i];
                        break;
                    }
                }
            }
        } while (*src != end);
    });
    if ((ret = ptls_decode8(&decoded->max_name_length, src, end)) != 0)
        goto Exit;

#define SKIP_DECODED()                                                                                                             \
    do {                                                                                                                           \
        decoded->kem = NULL;                                                                                                       \
        decoded->cipher = NULL;                                                                                                    \
    } while (0)

    /* Decode public_name. The specification requires clients to ignore (upon parsing ESNIConfigList) or reject (upon handshake)
     * public names that are not DNS names or IPv4 addresses. We ignore IPv4 and v6 addresses during parsing (IPv6 addresses never
     * looks like DNS names), and delegate the responsibility of rejecting non-DNS names to the certificate verify callback. */
    ptls_decode_open_block(*src, end, 1, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((public_name_buf = duplicate_as_str(*src, end - *src)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (ptls_server_name_is_ipaddr(public_name_buf)) {
            SKIP_DECODED();
        } else {
            decoded->public_name = ptls_iovec_init(*src, end - *src);
        }
        *src = end;
    });

    ptls_decode_block(*src, end, 2, {
        while (*src < end) {
            uint16_t type;
            if ((ret = ptls_decode16(&type, src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(*src, end, 2, { *src = end; });
            /* if a critital extension is found, indicate that the config cannot be used */
            if ((type & 0x8000) != 0)
                SKIP_DECODED();
        }
    });

#undef SKIP_DECODED

Exit:
    free(public_name_buf);
    return ret;
}